

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssbinLoader.cpp
# Opt level: O2

void __thiscall
Assimp::AssbinImporter::ReadBinaryScene(AssbinImporter *this,IOStream *stream,aiScene *scene)

{
  uint uVar1;
  aiMesh **__s;
  aiMesh *this_00;
  aiMaterial **__s_00;
  AssbinImporter *this_01;
  aiAnimation **__s_01;
  aiAnimation *this_02;
  aiTexture **__s_02;
  aiTexture *paVar2;
  aiLight **__s_03;
  aiLight *this_03;
  aiCamera **__s_04;
  aiCamera *this_04;
  DeadlyImportError *this_05;
  ulong uVar3;
  AssbinImporter *this_06;
  aiLight *this_07;
  aiCamera *this_08;
  uint i_3;
  uint i;
  ulong uVar4;
  allocator local_51;
  string local_50;
  
  uVar1 = Read<unsigned_int>(stream);
  if (uVar1 == 0x1239) {
    Read<unsigned_int>(stream);
    uVar1 = Read<unsigned_int>(stream);
    scene->mFlags = uVar1;
    uVar1 = Read<unsigned_int>(stream);
    scene->mNumMeshes = uVar1;
    uVar1 = Read<unsigned_int>(stream);
    scene->mNumMaterials = uVar1;
    uVar1 = Read<unsigned_int>(stream);
    scene->mNumAnimations = uVar1;
    uVar1 = Read<unsigned_int>(stream);
    scene->mNumTextures = uVar1;
    uVar1 = Read<unsigned_int>(stream);
    scene->mNumLights = uVar1;
    uVar1 = Read<unsigned_int>(stream);
    scene->mNumCameras = uVar1;
    ReadBinaryNode(this,stream,&scene->mRootNode,(aiNode *)0x0);
    uVar3 = (ulong)scene->mNumMeshes;
    if (uVar3 != 0) {
      __s = (aiMesh **)operator_new__(uVar3 << 3);
      scene->mMeshes = __s;
      memset(__s,0,uVar3 << 3);
      for (uVar4 = 0; uVar4 < uVar3; uVar4 = uVar4 + 1) {
        this_00 = (aiMesh *)operator_new(0x520);
        aiMesh::aiMesh(this_00);
        scene->mMeshes[uVar4] = this_00;
        ReadBinaryMesh(this,stream,scene->mMeshes[uVar4]);
        uVar3 = (ulong)scene->mNumMeshes;
      }
    }
    uVar3 = (ulong)scene->mNumMaterials;
    if (uVar3 != 0) {
      __s_00 = (aiMaterial **)operator_new__(uVar3 << 3);
      scene->mMaterials = __s_00;
      memset(__s_00,0,uVar3 << 3);
      for (uVar4 = 0; uVar4 < uVar3; uVar4 = uVar4 + 1) {
        this_01 = (AssbinImporter *)operator_new(0x10);
        this_06 = this_01;
        aiMaterial::aiMaterial((aiMaterial *)this_01);
        scene->mMaterials[uVar4] = (aiMaterial *)this_01;
        ReadBinaryMaterial(this_06,stream,scene->mMaterials[uVar4]);
        uVar3 = (ulong)scene->mNumMaterials;
      }
    }
    uVar3 = (ulong)scene->mNumAnimations;
    if (uVar3 != 0) {
      __s_01 = (aiAnimation **)operator_new__(uVar3 << 3);
      scene->mAnimations = __s_01;
      memset(__s_01,0,uVar3 << 3);
      for (uVar4 = 0; uVar4 < uVar3; uVar4 = uVar4 + 1) {
        this_02 = (aiAnimation *)operator_new(0x448);
        aiAnimation::aiAnimation(this_02);
        scene->mAnimations[uVar4] = this_02;
        ReadBinaryAnim(this,stream,scene->mAnimations[uVar4]);
        uVar3 = (ulong)scene->mNumAnimations;
      }
    }
    uVar3 = (ulong)scene->mNumTextures;
    if (uVar3 != 0) {
      __s_02 = (aiTexture **)operator_new__(uVar3 << 3);
      scene->mTextures = __s_02;
      memset(__s_02,0,uVar3 << 3);
      for (uVar4 = 0; uVar4 < uVar3; uVar4 = uVar4 + 1) {
        paVar2 = (aiTexture *)operator_new(0x428);
        paVar2->mWidth = 0;
        paVar2->mHeight = 0;
        paVar2->pcData = (aiTexel *)0x0;
        (paVar2->mFilename).length = 0;
        (paVar2->mFilename).data[0] = '\0';
        memset((paVar2->mFilename).data + 1,0x1b,0x3ff);
        paVar2->achFormatHint[0] = '\0';
        paVar2->achFormatHint[1] = '\0';
        paVar2->achFormatHint[2] = '\0';
        paVar2->achFormatHint[3] = '\0';
        scene->mTextures[uVar4] = paVar2;
        ReadBinaryTexture(this,stream,scene->mTextures[uVar4]);
        uVar3 = (ulong)scene->mNumTextures;
      }
    }
    uVar3 = (ulong)scene->mNumLights;
    if (uVar3 != 0) {
      __s_03 = (aiLight **)operator_new__(uVar3 << 3);
      scene->mLights = __s_03;
      memset(__s_03,0,uVar3 << 3);
      for (uVar4 = 0; uVar4 < uVar3; uVar4 = uVar4 + 1) {
        this_03 = (aiLight *)operator_new(0x46c);
        this_07 = this_03;
        aiLight::aiLight(this_03);
        scene->mLights[uVar4] = this_03;
        ReadBinaryLight((AssbinImporter *)this_07,stream,scene->mLights[uVar4]);
        uVar3 = (ulong)scene->mNumLights;
      }
    }
    uVar3 = (ulong)scene->mNumCameras;
    if (uVar3 != 0) {
      __s_04 = (aiCamera **)operator_new__(uVar3 << 3);
      scene->mCameras = __s_04;
      memset(__s_04,0,uVar3 << 3);
      for (uVar4 = 0; uVar4 < uVar3; uVar4 = uVar4 + 1) {
        this_04 = (aiCamera *)operator_new(0x438);
        this_08 = this_04;
        aiCamera::aiCamera(this_04);
        scene->mCameras[uVar4] = this_04;
        ReadBinaryCamera((AssbinImporter *)this_08,stream,scene->mCameras[uVar4]);
        uVar3 = (ulong)scene->mNumCameras;
      }
    }
    return;
  }
  this_05 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
  std::__cxx11::string::string((string *)&local_50,"Magic chunk identifiers are wrong!",&local_51);
  DeadlyImportError::DeadlyImportError(this_05,&local_50);
  __cxa_throw(this_05,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void AssbinImporter::ReadBinaryScene( IOStream * stream, aiScene* scene ) {
    if(Read<uint32_t>(stream) != ASSBIN_CHUNK_AISCENE)
        throw DeadlyImportError("Magic chunk identifiers are wrong!");
    /*uint32_t size =*/ Read<uint32_t>(stream);

    scene->mFlags         = Read<unsigned int>(stream);
    scene->mNumMeshes     = Read<unsigned int>(stream);
    scene->mNumMaterials  = Read<unsigned int>(stream);
    scene->mNumAnimations = Read<unsigned int>(stream);
    scene->mNumTextures   = Read<unsigned int>(stream);
    scene->mNumLights     = Read<unsigned int>(stream);
    scene->mNumCameras    = Read<unsigned int>(stream);

    // Read node graph
    //scene->mRootNode = new aiNode[1];
    ReadBinaryNode( stream, &scene->mRootNode, (aiNode*)NULL );

    // Read all meshes
    if (scene->mNumMeshes) {
        scene->mMeshes = new aiMesh*[scene->mNumMeshes];
        memset(scene->mMeshes, 0, scene->mNumMeshes*sizeof(aiMesh*));
        for (unsigned int i = 0; i < scene->mNumMeshes;++i) {
            scene->mMeshes[i] = new aiMesh();
            ReadBinaryMesh( stream,scene->mMeshes[i]);
        }
    }

    // Read materials
    if (scene->mNumMaterials) {
        scene->mMaterials = new aiMaterial*[scene->mNumMaterials];
        memset(scene->mMaterials, 0, scene->mNumMaterials*sizeof(aiMaterial*));
        for (unsigned int i = 0; i< scene->mNumMaterials; ++i) {
            scene->mMaterials[i] = new aiMaterial();
            ReadBinaryMaterial(stream,scene->mMaterials[i]);
        }
    }

    // Read all animations
    if (scene->mNumAnimations) {
        scene->mAnimations = new aiAnimation*[scene->mNumAnimations];
        memset(scene->mAnimations, 0, scene->mNumAnimations*sizeof(aiAnimation*));
        for (unsigned int i = 0; i < scene->mNumAnimations;++i) {
            scene->mAnimations[i] = new aiAnimation();
            ReadBinaryAnim(stream,scene->mAnimations[i]);
        }
    }

    // Read all textures
    if (scene->mNumTextures) {
        scene->mTextures = new aiTexture*[scene->mNumTextures];
        memset(scene->mTextures, 0, scene->mNumTextures*sizeof(aiTexture*));
        for (unsigned int i = 0; i < scene->mNumTextures;++i) {
            scene->mTextures[i] = new aiTexture();
            ReadBinaryTexture(stream,scene->mTextures[i]);
        }
    }

    // Read lights
    if (scene->mNumLights) {
        scene->mLights = new aiLight*[scene->mNumLights];
        memset(scene->mLights, 0, scene->mNumLights*sizeof(aiLight*));
        for (unsigned int i = 0; i < scene->mNumLights;++i) {
            scene->mLights[i] = new aiLight();
            ReadBinaryLight(stream,scene->mLights[i]);
        }
    }

    // Read cameras
    if (scene->mNumCameras) {
        scene->mCameras = new aiCamera*[scene->mNumCameras];
        memset(scene->mCameras, 0, scene->mNumCameras*sizeof(aiCamera*));
        for (unsigned int i = 0; i < scene->mNumCameras;++i) {
            scene->mCameras[i] = new aiCamera();
            ReadBinaryCamera(stream,scene->mCameras[i]);
        }
    }

}